

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void print_xml_help_option_element(ctmbstr element,ctmbstr name)

{
  tmbstr __ptr;
  tmbstr escpName;
  ctmbstr name_local;
  ctmbstr element_local;
  
  if (name != (ctmbstr)0x0) {
    __ptr = get_escaped_name(name);
    printf("  <%s>%s</%s>\n",element,__ptr,element);
    free(__ptr);
  }
  return;
}

Assistant:

static void print_xml_help_option_element( ctmbstr element, ctmbstr name )
{
    tmbstr escpName;
    if (!name)
        return;
    printf("  <%s>%s</%s>\n", element, escpName = get_escaped_name(name),
           element);
    free(escpName);
}